

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sector.cpp
# Opt level: O1

void __thiscall Sector::set_baddatacrc(Sector *this,bool bad)

{
  vector<Data,_std::allocator<Data>_> *this_00;
  pointer pDVar1;
  vector<unsigned_char,std::allocator<unsigned_char>> *pvVar2;
  int iVar3;
  int iVar4;
  undefined7 in_register_00000031;
  uint8_t fill_byte;
  Data pad;
  value_type local_32;
  allocator_type local_31;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  
  this->m_bad_data_crc = bad;
  if ((int)CONCAT71(in_register_00000031,bad) != 0) {
    return;
  }
  iVar3 = 0;
  if (0 < opt.fill) {
    iVar3 = opt.fill;
  }
  local_32 = (value_type)iVar3;
  this_00 = &this->m_data;
  iVar3 = (int)((long)(this->m_data).super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->m_data).super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) * -0x55555555;
  if (iVar3 == 0) {
    iVar3 = Header::sector_size(&this->header);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_30,(long)iVar3,&local_32,&local_31);
    std::vector<Data,_std::allocator<Data>_>::emplace_back<Data>(this_00,(Data *)&local_30);
  }
  else {
    if (iVar3 < 2) {
      return;
    }
    std::vector<Data,_std::allocator<Data>_>::resize(this_00,1);
    pDVar1 = (this->m_data).super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((int)((ulong)((long)(this->m_data).super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)pDVar1) >> 3) * -0x55555555 ==
        0) {
      iVar3 = 0;
    }
    else {
      iVar3 = *(int *)((long)&(pDVar1->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl + 8) -
              *(int *)&(pDVar1->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl;
    }
    iVar4 = Header::sector_size(&this->header);
    if (iVar4 <= iVar3) {
      return;
    }
    iVar3 = Header::sector_size(&this->header);
    pDVar1 = (this->m_data).super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((int)((ulong)((long)(this->m_data).super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)pDVar1) >> 3) * -0x55555555 ==
        0) {
      iVar4 = 0;
    }
    else {
      iVar4 = *(int *)&(pDVar1->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl -
              *(int *)((long)&(pDVar1->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl + 8);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_30,(long)(iVar4 + iVar3),&local_32,&local_31);
    pvVar2 = (vector<unsigned_char,std::allocator<unsigned_char>> *)
             (this_00->super__Vector_base<Data,_std::allocator<Data>_>)._M_impl.
             super__Vector_impl_data._M_start;
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              (pvVar2,*(undefined8 *)pvVar2,
               local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish);
  }
  if (local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Sector::set_baddatacrc(bool bad)
{
    m_bad_data_crc = bad;

    if (!bad)
    {
        auto fill_byte = static_cast<uint8_t>((opt.fill >= 0) ? opt.fill : 0);

        if (!has_data())
            m_data.push_back(Data(size(), fill_byte));
        else if (copies() > 1)
        {
            m_data.resize(1);

            if (data_size() < size())
            {
                auto pad{ Data(size() - data_size(), fill_byte) };
                m_data[0].insert(m_data[0].begin(), pad.begin(), pad.end());
            }
        }
    }
}